

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_strncat_s(char *dst,size_t dstSizeInBytes,char *src,size_t count)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  
  iVar1 = 0x16;
  if (dst != (char *)0x0) {
    if (dstSizeInBytes == 0) {
      iVar1 = 0x22;
    }
    else {
      pcVar3 = dst;
      if (src != (char *)0x0) {
        for (; dstSizeInBytes != 0; dstSizeInBytes = dstSizeInBytes - 1) {
          if (*pcVar3 == '\0') {
            sVar4 = dstSizeInBytes - 1;
            if (count != 0xffffffffffffffff) {
              sVar4 = count;
            }
            sVar2 = 0;
            iVar1 = 0x22;
            goto LAB_00138dea;
          }
          pcVar3 = pcVar3 + 1;
        }
      }
    }
  }
  return iVar1;
LAB_00138dea:
  if (dstSizeInBytes == sVar2) {
LAB_00138e0e:
    *dst = '\0';
    return iVar1;
  }
  if ((src[sVar2] == '\0') || (sVar4 == sVar2)) {
    dst = pcVar3 + sVar2;
    iVar1 = 0;
    goto LAB_00138e0e;
  }
  pcVar3[sVar2] = src[sVar2];
  sVar2 = sVar2 + 1;
  goto LAB_00138dea;
}

Assistant:

MA_API MA_NO_INLINE int ma_strncat_s(char* dst, size_t dstSizeInBytes, const char* src, size_t count)
{
    char* dstorig;

    if (dst == 0) {
        return 22;
    }
    if (dstSizeInBytes == 0) {
        return 34;
    }
    if (src == 0) {
        return 22;
    }

    dstorig = dst;

    while (dstSizeInBytes > 0 && dst[0] != '\0') {
        dst += 1;
        dstSizeInBytes -= 1;
    }

    if (dstSizeInBytes == 0) {
        return 22;  /* Unterminated. */
    }


    if (count == ((size_t)-1)) {        /* _TRUNCATE */
        count = dstSizeInBytes - 1;
    }

    while (dstSizeInBytes > 0 && src[0] != '\0' && count > 0) {
        *dst++ = *src++;
        dstSizeInBytes -= 1;
        count -= 1;
    }

    if (dstSizeInBytes > 0) {
        dst[0] = '\0';
    } else {
        dstorig[0] = '\0';
        return 34;
    }

    return 0;
}